

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

void __thiscall
Js::ParseableFunctionInfo::ForEachNestedFunc<ByteCodeGenerator::EmitOneFunction(ParseNodeFnc*)::__4>
          (ParseableFunctionInfo *this,anon_class_8_1_3e9b088b fn)

{
  LocalFunctionId functionID;
  FunctionProxy *this_00;
  Utf8SourceInfo *this_01;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseableFunctionInfo *pPVar4;
  FunctionInfo *pFVar5;
  ulong uVar6;
  
  if ((this != (ParseableFunctionInfo *)0x0) &&
     (*(int *)&(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject != 0)) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar6 = 0;
    do {
      this_00 = *(FunctionProxy **)
                 (((&(this->super_FunctionProxy).auxPtrs)[uVar6].ptr)->offsets + 6);
      if (this_00 != (FunctionProxy *)0x0) {
        pFVar5 = (this_00->functionInfo).ptr;
        if (pFVar5 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_00807a1d;
          *puVar3 = 0;
          pFVar5 = (this_00->functionInfo).ptr;
        }
        if ((pFVar5->functionBodyImpl).ptr != this_00) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                      "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar2) goto LAB_00807a1d;
          *puVar3 = 0;
          pFVar5 = (this_00->functionInfo).ptr;
        }
        if ((pFVar5->attributes & DeferredParse) != None) {
          pPVar4 = FunctionProxy::GetParseableFunctionInfo(this_00);
          if (((pPVar4->super_FunctionProxy).field_0x45 & 4) != 0) {
            this_01 = ((*fn.byteCodeFunction)->super_ParseableFunctionInfo).super_FunctionProxy.
                      m_utf8SourceInfo.ptr;
            pFVar5 = (this_00->functionInfo).ptr;
            if (pFVar5 == (FunctionInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar3 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar2) {
LAB_00807a1d:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar3 = 0;
              pFVar5 = (this_00->functionInfo).ptr;
            }
            functionID = pFVar5->functionId;
            pPVar4 = FunctionProxy::GetParseableFunctionInfo(this_00);
            Utf8SourceInfo::TrackDeferredFunction(this_01,functionID,pPVar4);
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)&(this->super_FunctionProxy).super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject);
  }
  return;
}

Assistant:

void ForEachNestedFunc(Fn fn)
        {
            NestedArray* nestedArray = GetNestedArray();
            if (nestedArray != nullptr)
            {
                for (uint i = 0; i < nestedArray->nestedCount; i++)
                {
                    if (!fn(nestedArray->functionInfoArray[i]->GetFunctionProxy(), i))
                    {
                        break;
                    }
                }
            }
        }